

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

MatrixXd * __thiscall ChebTools::UMatrixLibrary::get(UMatrixLibrary *this,size_t N)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  size_t N_local;
  UMatrixLibrary *this_local;
  
  it._M_node = (_Base_ptr)N;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
       ::find(&this->matrices,(key_type_conflict *)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
       ::end(&this->matrices);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator->(&local_28);
  }
  else {
    build(this,(size_t)it._M_node);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
         ::find(&this->matrices,(key_type_conflict *)&it);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator->(&local_38);
  }
  this_local = (UMatrixLibrary *)&ppVar2->second;
  return (MatrixXd *)this_local;
}

Assistant:

const Eigen::MatrixXd & get(std::size_t N) {
            auto it = matrices.find(N);
            if (it != matrices.end()) {
                return it->second;
            }
            else {
                build(N);
                return matrices.find(N)->second;
            }
        }